

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

QList<QMap<QString,_QVariant>_> * provisioningTeams(void)

{
  QLatin1StringView str;
  QLatin1StringView str_00;
  bool bVar1;
  iterator o;
  iterator __first;
  iterator __last;
  iterator in_RDI;
  long in_FS_OFFSET;
  QVariant *team;
  QList<QVariant> *__range2;
  QVariant *associatedTeams;
  QString *accountIdentifier;
  QKeyValueRange<QMap<QString,_QVariant>_&> *__range1;
  QList<QMap<QString,_QVariant>_> *flatTeams;
  iterator __end2;
  iterator __begin2;
  key_value_iterator __end1;
  key_value_iterator __begin1;
  QVariantMap teamMap;
  QSettings xcodeSettings;
  QStringBuilder<QString,_QLatin1String> *in_stack_fffffffffffffe18;
  iterator lhs;
  QLatin1String *in_stack_fffffffffffffe30;
  QKeyValueIterator<const_QString_&,_QVariant_&,_QMap<QString,_QVariant>::iterator>
  *in_stack_fffffffffffffe38;
  iterator local_168 [4];
  pair<const_QString_&,_QVariant_&> local_148;
  iterator local_138;
  _Base_ptr local_130;
  iterator local_128;
  iterator local_120;
  QKeyValueRangeStorage<QMap<QString,_QVariant>_&> local_118;
  undefined8 local_c8;
  undefined1 local_70 [24];
  undefined8 local_58;
  undefined8 local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  lhs._M_node = in_RDI._M_node;
  QDir::homePath();
  QLatin1String::QLatin1String(in_stack_fffffffffffffe30,(char *)lhs._M_node);
  operator+((QString *)lhs._M_node,(QLatin1String *)in_RDI._M_node);
  QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe18);
  QSettings::QSettings((QSettings *)&local_58,(QString *)local_70,NativeFormat,(QObject *)0x0);
  QString::~QString((QString *)0x13bf03);
  QStringBuilder<QString,_QLatin1String>::~QStringBuilder
            ((QStringBuilder<QString,_QLatin1String> *)0x13bf10);
  QString::~QString((QString *)0x13bf1d);
  local_c8 = 0xaaaaaaaaaaaaaaaa;
  QLatin1String::QLatin1String(in_stack_fffffffffffffe30,(char *)lhs._M_node);
  str.m_data = (char *)in_stack_fffffffffffffe38;
  str.m_size = (qsizetype)in_stack_fffffffffffffe30;
  QAnyStringView::QAnyStringView((QAnyStringView *)lhs._M_node,str);
  QSettings::value((QAnyStringView *)&local_28);
  QVariant::toMap();
  QVariant::~QVariant(&local_28);
  bVar1 = QMap<QString,_QVariant>::isEmpty((QMap<QString,_QVariant> *)in_RDI._M_node);
  if (bVar1) {
    QLatin1String::QLatin1String(in_stack_fffffffffffffe30,(char *)lhs._M_node);
    str_00.m_data = (char *)in_stack_fffffffffffffe38;
    str_00.m_size = (qsizetype)in_stack_fffffffffffffe30;
    QAnyStringView::QAnyStringView((QAnyStringView *)lhs._M_node,str_00);
    QSettings::value((QAnyStringView *)&local_48);
    QVariant::toMap();
    QMap<QString,_QVariant>::operator=
              ((QMap<QString,_QVariant> *)in_RDI._M_node,
               (QMap<QString,_QVariant> *)in_stack_fffffffffffffe18);
    QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x13c047);
    QVariant::~QVariant(&local_48);
  }
  *(undefined8 *)in_RDI._M_node = 0xaaaaaaaaaaaaaaaa;
  (in_RDI._M_node)->_M_parent = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  (in_RDI._M_node)->_M_left = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QList<QMap<QString,_QVariant>_>::QList((QList<QMap<QString,_QVariant>_> *)0x13c083);
  local_118.m_map =
       (QMap<QString,_QVariant> *)
       QMap<QString,_QVariant>::asKeyValueRange((QMap<QString,_QVariant> *)in_RDI._M_node);
  local_120._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_120._M_node =
       (_Base_ptr)
       QtPrivate::QKeyValueRange<QMap<QString,_QVariant>_&>::begin
                 ((QKeyValueRange<QMap<QString,_QVariant>_&> *)in_stack_fffffffffffffe18);
  local_128.i._M_node = (iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_128.i._M_node =
       (iterator)
       QtPrivate::QKeyValueRange<QMap<QString,_QVariant>_&>::end
                 ((QKeyValueRange<QMap<QString,_QVariant>_&> *)in_stack_fffffffffffffe18);
  while( true ) {
    local_130 = local_120._M_node;
    local_138 = local_128.i._M_node;
    bVar1 = operator!=((QKeyValueIterator<const_QString_&,_QVariant_&,_QMap<QString,_QVariant>::iterator>
                        )lhs._M_node,
                       (QKeyValueIterator<const_QString_&,_QVariant_&,_QMap<QString,_QVariant>::iterator>
                        )in_RDI._M_node);
    if (!bVar1) break;
    local_148 = QKeyValueIterator<const_QString_&,_QVariant_&,_QMap<QString,_QVariant>::iterator>::
                operator*(in_stack_fffffffffffffe38);
    std::get<0ul,QString_const&,QVariant&>((pair<const_QString_&,_QVariant_&> *)0x13c186);
    std::get<1ul,QString_const&,QVariant&>((pair<const_QString_&,_QVariant_&> *)0x13c1a4);
    QVariant::toList();
    local_168[0].i = (QVariant *)0xaaaaaaaaaaaaaaaa;
    local_168[0] = QList<QVariant>::begin((QList<QVariant> *)in_RDI._M_node);
    o = QList<QVariant>::end((QList<QVariant> *)in_RDI._M_node);
    while (bVar1 = QList<QVariant>::iterator::operator!=(local_168,o), bVar1) {
      QList<QVariant>::iterator::operator*(local_168);
      QVariant::toMap();
      QList<QMap<QString,_QVariant>_>::append
                ((QList<QMap<QString,_QVariant>_> *)in_RDI._M_node,
                 (rvalue_ref)in_stack_fffffffffffffe18);
      QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x13c28b);
      QList<QVariant>::iterator::operator++(local_168);
    }
    QList<QVariant>::~QList((QList<QVariant> *)0x13c240);
    QKeyValueIterator<const_QString_&,_QVariant_&,_QMap<QString,_QVariant>::iterator>::operator++
              ((QKeyValueIterator<const_QString_&,_QVariant_&,_QMap<QString,_QVariant>::iterator> *)
               in_RDI._M_node);
  }
  __first = QList<QMap<QString,_QVariant>_>::begin
                      ((QList<QMap<QString,_QVariant>_> *)in_RDI._M_node);
  __last = QList<QMap<QString,_QVariant>_>::end((QList<QMap<QString,_QVariant>_> *)in_RDI._M_node);
  std::
  sort<QList<QMap<QString,QVariant>>::iterator,bool(*)(QMap<QString,QVariant>const&,QMap<QString,QVariant>const&)>
            (__first,__last,
             (_func_bool_QMap<QString,_QVariant>_ptr_QMap<QString,_QVariant>_ptr *)
             in_stack_fffffffffffffe18);
  QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x13c308);
  QSettings::~QSettings((QSettings *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QMap<QString,_QVariant>_> *)lhs._M_node;
  }
  __stack_chk_fail();
}

Assistant:

static QList<QVariantMap> provisioningTeams()
{
    const QSettings xcodeSettings(
        QDir::homePath() + QLatin1String("/Library/Preferences/com.apple.dt.Xcode.plist"),
        QSettings::NativeFormat);

    QVariantMap teamMap = xcodeSettings.value(QLatin1String("IDEProvisioningTeamByIdentifier")).toMap();
    if (teamMap.isEmpty())
        teamMap = xcodeSettings.value(QLatin1String("IDEProvisioningTeams")).toMap();

    QList<QVariantMap> flatTeams;
    for (const auto &[accountIdentifier, associatedTeams] : teamMap.asKeyValueRange()) {
        for (const auto &team : associatedTeams.toList())
            flatTeams.append(team.toMap());
    }

    // Sort teams so that Free Provisioning teams come last
    std::sort(flatTeams.begin(), flatTeams.end(), ::compareProvisioningTeams);
    return flatTeams;
}